

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.h
# Opt level: O2

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this)

{
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f840;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_g = (FactorGraph *)0x0;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bestConfiguration).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_k = 1;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  this->writeAnyTimeResults = false;
  this->results_f = (ofstream *)SUB168(ZEXT416(0) << 0x40,0);
  this->timings_f = (ofstream *)SUB168(ZEXT416(0) << 0x40,8);
  return;
}

Assistant:

MaxPlus() : 
                DAIAlgFG(), Props(), _maxdiff(0.0), _iterations(0UL), _indices(),
                _messages(), _newmessages(), _g(NULL),_k(1),
                _k_th_Val(-DBL_MAX),  writeAnyTimeResults(false),  
                results_f(NULL), timings_f(NULL){}